

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool read_blob(BinarySource *src,int nlines,BinarySink *bs)

{
  int iVar1;
  void *ptr;
  char *__s;
  size_t sVar2;
  uchar local_4b [3];
  int local_48;
  int iStack_44;
  uchar decoded [3];
  int k;
  int j;
  int i;
  int linelen;
  char *line;
  uchar *blob;
  BinarySink *bs_local;
  int nlines_local;
  BinarySource *src_local;
  
  if (0x1554 < nlines) {
    __assert_fail("nlines < MAX_KEY_BLOB_LINES",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                  0x20d,"_Bool read_blob(BinarySource *, int, BinarySink *)");
  }
  ptr = safemalloc((long)(nlines * 0x30),1,0);
  k = 0;
  while( true ) {
    if (nlines <= k) {
      safefree(ptr);
      return true;
    }
    __s = read_body(src);
    if (__s == (char *)0x0) break;
    sVar2 = strlen(__s);
    iVar1 = (int)sVar2;
    if ((iVar1 % 4 != 0) || (0x40 < iVar1)) {
      safefree(ptr);
      safefree(__s);
      return false;
    }
    for (iStack_44 = 0; iStack_44 < iVar1; iStack_44 = iStack_44 + 4) {
      local_48 = base64_decode_atom(__s + iStack_44,local_4b);
      if (local_48 == 0) {
        safefree(__s);
        safefree(ptr);
        return false;
      }
      BinarySink_put_data(bs->binarysink_,local_4b,(long)local_48);
    }
    safefree(__s);
    k = k + 1;
  }
  safefree(ptr);
  return false;
}

Assistant:

static bool read_blob(BinarySource *src, int nlines, BinarySink *bs)
{
    unsigned char *blob;
    char *line;
    int linelen;
    int i, j, k;

    /* We expect at most 64 base64 characters, ie 48 real bytes, per line. */
    assert(nlines < MAX_KEY_BLOB_LINES);
    blob = snewn(48 * nlines, unsigned char);

    for (i = 0; i < nlines; i++) {
        line = read_body(src);
        if (!line) {
            sfree(blob);
            return false;
        }
        linelen = strlen(line);
        if (linelen % 4 != 0 || linelen > 64) {
            sfree(blob);
            sfree(line);
            return false;
        }
        for (j = 0; j < linelen; j += 4) {
            unsigned char decoded[3];
            k = base64_decode_atom(line + j, decoded);
            if (!k) {
                sfree(line);
                sfree(blob);
                return false;
            }
            put_data(bs, decoded, k);
        }
        sfree(line);
    }
    sfree(blob);
    return true;
}